

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void fchown_cb(uv_fs_t *req)

{
  uv_fs_t *req_local;
  
  if (req->fs_type != UV_FS_FCHOWN) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x111,"req->fs_type == UV_FS_FCHOWN");
    abort();
  }
  if (req->result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x112,"req->result == 0");
    abort();
  }
  fchown_cb_count = fchown_cb_count + 1;
  uv_fs_req_cleanup(req);
  return;
}

Assistant:

static void fchown_cb(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_FCHOWN);
  ASSERT(req->result == 0);
  fchown_cb_count++;
  uv_fs_req_cleanup(req);
}